

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompression.cpp
# Opt level: O1

void __thiscall
duckdb::CompressedStringScanState::ScanToFlatVector
          (CompressedStringScanState *this,Vector *result,idx_t result_offset,idx_t start,
          idx_t scan_count)

{
  byte bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint32_t *puVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  unsigned_long uVar5;
  SelectionVector *pSVar6;
  uint16_t string_len;
  ulong uVar7;
  ulong uVar8;
  sel_t *out;
  data_ptr_t pdVar9;
  ulong uVar10;
  ulong uVar11;
  string_t sVar12;
  idx_t decompress_count;
  ulong local_70;
  data_ptr_t local_68;
  idx_t local_60;
  long local_58;
  data_ptr_t local_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  local_68 = result->data;
  uVar8 = (ulong)((uint)start & 0x1f);
  uVar10 = uVar8 + scan_count;
  local_60 = result_offset;
  if ((uVar10 & 0x1f) != 0) {
    uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar10 & 0x1f);
    uVar10 = (uVar10 - uVar5) + 0x20;
  }
  local_70 = uVar10;
  if (((this->sel_vec).internal.
       super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) || (this->sel_vec_size < uVar10)) {
    this->sel_vec_size = uVar10;
    make_buffer<duckdb::SelectionVector,unsigned_long&>((duckdb *)&local_48,&local_70);
    p_Var4 = p_Stack_40;
    peVar3 = local_48;
    local_48 = (element_type *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->sel_vec).internal.
              super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->sel_vec).internal.super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar3;
    (this->sel_vec).internal.super___shared_ptr<duckdb::SelectionVector,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
  }
  local_50 = this->base_data + ((ulong)this->current_width * (start & 0xffffffffffffffe0) >> 3);
  pSVar6 = shared_ptr<duckdb::SelectionVector,_true>::operator->(&this->sel_vec);
  uVar10 = local_70;
  if (local_70 != 0) {
    out = pSVar6->sel_vector;
    bVar1 = this->current_width;
    local_58 = (ulong)bVar1 << 5;
    uVar11 = 0;
    uVar7 = 0;
    do {
      duckdb_fastpforlib::fastunpack((uint32_t *)(local_50 + (uVar11 >> 3)),out,(uint)bVar1);
      uVar7 = uVar7 + 0x20;
      uVar11 = uVar11 + local_58;
      out = out + 0x20;
    } while (uVar7 < uVar10);
  }
  if (scan_count != 0) {
    pdVar9 = local_68 + local_60 * 0x10 + 8;
    do {
      pSVar6 = shared_ptr<duckdb::SelectionVector,_true>::operator->(&this->sel_vec);
      uVar10 = uVar8;
      if (pSVar6->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)pSVar6->sel_vector[uVar8];
      }
      puVar2 = this->index_buffer_ptr;
      if ((int)uVar10 == 0) {
        string_len = 0;
      }
      else {
        string_len = (short)puVar2[uVar10 & 0xffffffff] - (short)puVar2[(int)uVar10 - 1];
      }
      sVar12 = FetchStringFromDict(this,puVar2[uVar10],string_len);
      *(long *)(pdVar9 + -8) = sVar12.value._0_8_;
      *(long *)pdVar9 = sVar12.value._8_8_;
      uVar8 = uVar8 + 1;
      pdVar9 = pdVar9 + 0x10;
      scan_count = scan_count - 1;
    } while (scan_count != 0);
  }
  return;
}

Assistant:

void CompressedStringScanState::ScanToFlatVector(Vector &result, idx_t result_offset, idx_t start, idx_t scan_count) {
	auto result_data = FlatVector::GetData<string_t>(result);

	// Handling non-bitpacking-group-aligned start values;
	idx_t start_offset = start % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

	// We will scan in blocks of BITPACKING_ALGORITHM_GROUP_SIZE, so we may scan some extra values.
	idx_t decompress_count = BitpackingPrimitives::RoundUpToAlgorithmGroupSize(scan_count + start_offset);

	// Create a decompression buffer of sufficient size if we don't already have one.
	if (!sel_vec || sel_vec_size < decompress_count) {
		sel_vec_size = decompress_count;
		sel_vec = make_buffer<SelectionVector>(decompress_count);
	}

	data_ptr_t src = &base_data[((start - start_offset) * current_width) / 8];
	sel_t *sel_vec_ptr = sel_vec->data();

	BitpackingPrimitives::UnPackBuffer<sel_t>(data_ptr_cast(sel_vec_ptr), src, decompress_count, current_width);

	for (idx_t i = 0; i < scan_count; i++) {
		// Lookup dict offset in index buffer
		auto string_number = sel_vec->get_index(i + start_offset);
		auto dict_offset = index_buffer_ptr[string_number];
		auto str_len = GetStringLength(UnsafeNumericCast<sel_t>(string_number));
		result_data[result_offset + i] = FetchStringFromDict(UnsafeNumericCast<int32_t>(dict_offset), str_len);
	}
}